

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::EmitAddtlInfo_SnapBoundFunctionInfo
               (SnapObject *snpObject,FileWriter *writer)

{
  SnapBoundFunctionInfo *pSVar1;
  uint32 i;
  ulong uVar2;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapBoundFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)8>
                     (snpObject);
  FileWriter::WriteAddr(writer,boundFunction,pSVar1->TargetFunction,CommaAndBigSpaceSeparator);
  FileWriter::WriteAddr(writer,boundThis,pSVar1->BoundThis,CommaSeparator);
  FileWriter::WriteLengthValue(writer,pSVar1->ArgCount,CommaSeparator);
  (*writer->_vptr_FileWriter[3])(writer,0x46,3);
  (*writer->_vptr_FileWriter[4])(writer,0);
  for (uVar2 = 0; uVar2 < pSVar1->ArgCount; uVar2 = uVar2 + 1) {
    NSSnapValues::EmitTTDVar(pSVar1->ArgArray[uVar2],writer,uVar2 != 0);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  return;
}

Assistant:

void EmitAddtlInfo_SnapBoundFunctionInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapBoundFunctionInfo* snapBoundInfo = SnapObjectGetAddtlInfoAs<SnapBoundFunctionInfo*, SnapObjectType::SnapBoundFunctionObject>(snpObject);

            writer->WriteAddr(NSTokens::Key::boundFunction, snapBoundInfo->TargetFunction, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteAddr(NSTokens::Key::boundThis, snapBoundInfo->BoundThis, NSTokens::Separator::CommaSeparator);
            writer->WriteLengthValue(snapBoundInfo->ArgCount, NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::boundArgs, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart();
            for(uint32 i = 0; i < snapBoundInfo->ArgCount; ++i)
            {
                NSSnapValues::EmitTTDVar(snapBoundInfo->ArgArray[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();
        }